

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

iterator __thiscall
cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Truncate
          (cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this)

{
  size_type sVar1;
  __normal_iterator<cmState::BuildsystemDirectoryStateType_*,_std::vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>_>
  local_78;
  const_iterator local_70;
  __normal_iterator<cmState::BuildsystemDirectoryStateType_*,_std::vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>_>
  local_68;
  __normal_iterator<cmState::BuildsystemDirectoryStateType_*,_std::vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>_>
  local_60;
  const_iterator local_58;
  unsigned_long *local_50;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_48;
  const_iterator local_40;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_38;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  local_30;
  const_iterator local_28;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *local_20;
  cmLinkedTree<cmState::BuildsystemDirectoryStateType> *this_local;
  
  local_20 = this;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->UpPositions);
  if (sVar1 == 0) {
    __assert_fail("this->UpPositions.size() > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0xb2,
                  "iterator cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Truncate() [T = cmState::BuildsystemDirectoryStateType]"
                 );
  }
  local_38._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin(&this->UpPositions);
  local_30 = __gnu_cxx::
             __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
             ::operator+(&local_38,1);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_28,&local_30);
  local_48._M_current =
       (unsigned_long *)
       std::vector<unsigned_long,_std::allocator<unsigned_long>_>::end(&this->UpPositions);
  __gnu_cxx::
  __normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>::
  __normal_iterator<unsigned_long*>
            ((__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>
              *)&local_40,&local_48);
  local_50 = (unsigned_long *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::erase
                       (&this->UpPositions,local_28,local_40);
  sVar1 = std::
          vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
          ::size(&this->Data);
  if (sVar1 != 0) {
    local_68._M_current =
         (BuildsystemDirectoryStateType *)
         std::
         vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
         ::begin(&this->Data);
    local_60 = __gnu_cxx::
               __normal_iterator<cmState::BuildsystemDirectoryStateType_*,_std::vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>_>
               ::operator+(&local_68,1);
    __gnu_cxx::
    __normal_iterator<cmState::BuildsystemDirectoryStateType_const*,std::vector<cmState::BuildsystemDirectoryStateType,std::allocator<cmState::BuildsystemDirectoryStateType>>>
    ::__normal_iterator<cmState::BuildsystemDirectoryStateType*>
              ((__normal_iterator<cmState::BuildsystemDirectoryStateType_const*,std::vector<cmState::BuildsystemDirectoryStateType,std::allocator<cmState::BuildsystemDirectoryStateType>>>
                *)&local_58,&local_60);
    local_78._M_current =
         (BuildsystemDirectoryStateType *)
         std::
         vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
         ::end(&this->Data);
    __gnu_cxx::
    __normal_iterator<cmState::BuildsystemDirectoryStateType_const*,std::vector<cmState::BuildsystemDirectoryStateType,std::allocator<cmState::BuildsystemDirectoryStateType>>>
    ::__normal_iterator<cmState::BuildsystemDirectoryStateType*>
              ((__normal_iterator<cmState::BuildsystemDirectoryStateType_const*,std::vector<cmState::BuildsystemDirectoryStateType,std::allocator<cmState::BuildsystemDirectoryStateType>>>
                *)&local_70,&local_78);
    std::
    vector<cmState::BuildsystemDirectoryStateType,_std::allocator<cmState::BuildsystemDirectoryStateType>_>
    ::erase(&this->Data,local_58,local_70);
    iterator::iterator((iterator *)&this_local,this,1);
    return _this_local;
  }
  __assert_fail("this->Data.size() > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0xb5,
                "iterator cmLinkedTree<cmState::BuildsystemDirectoryStateType>::Truncate() [T = cmState::BuildsystemDirectoryStateType]"
               );
}

Assistant:

iterator Truncate()
  {
    assert(this->UpPositions.size() > 0);
    this->UpPositions.erase(this->UpPositions.begin() + 1,
                            this->UpPositions.end());
    assert(this->Data.size() > 0);
    this->Data.erase(this->Data.begin() + 1, this->Data.end());
    return iterator(this, 1);
  }